

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DShadowTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DShadowTestInstance *this)

{
  TextureRenderer *this_00;
  size_type *psVar1;
  pointer pfVar2;
  ulong uVar3;
  int *piVar4;
  ostringstream *poVar5;
  TextureFormat log;
  ParameterType *pPVar6;
  TestContext *pTVar7;
  bool bVar8;
  int iVar9;
  deUint32 width;
  deUint32 height;
  TestTexture2D *pTVar10;
  undefined4 extraout_var;
  undefined8 *puVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar12;
  ulong uVar13;
  void *data;
  pointer pFVar14;
  vector<float,_std::allocator<float>_> texCoord;
  Surface rendered;
  TextureFormat local_320;
  ulong *local_318;
  int local_310;
  undefined4 uStack_30c;
  ulong local_308 [2];
  TexComparePrecision local_2f8;
  PixelFormat pixelFormat;
  ulong local_2b8 [2];
  ScopedLogSection section;
  undefined1 local_290 [76];
  long lStack_244;
  long local_23c;
  int iStack_234;
  CompareMode CStack_230;
  int local_22c;
  anon_union_16_3_1194ccdc_for_v local_228;
  undefined8 local_218;
  LodMode local_210;
  undefined1 local_1f8 [112];
  ios_base local_188 [8];
  ios_base local_180 [264];
  TextureFormat texFmt;
  TextureFormatInfo fmtInfo;
  
  log = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &this->m_renderer;
  pTVar10 = util::TextureRenderer::get2DTexture
                      (this_00,(this->m_cases).
                               super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->m_caseNdx].
                               textureIndex);
  iVar9 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0xe])();
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar9);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  piVar4 = local_2f8.uvwBits.m_data + 1;
  local_2f8.coordBits.m_data._0_8_ = piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar3 = (long)rendered.m_pixels.m_ptr +
          CONCAT44(local_2f8.uvwBits.m_data[0],local_2f8.coordBits.m_data[2]);
  uVar13 = 0xf;
  if ((int *)local_2f8.coordBits.m_data._0_8_ != piVar4) {
    uVar13 = CONCAT44(local_2f8.uvwBits.m_data[2],local_2f8.uvwBits.m_data[1]);
  }
  if (uVar13 < uVar3) {
    uVar13 = 0xf;
    if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
      uVar13 = rendered.m_pixels.m_cap;
    }
    if (uVar13 < uVar3) goto LAB_00819e75;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&rendered,0,(char *)0x0,local_2f8.coordBits.m_data._0_8_);
  }
  else {
LAB_00819e75:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_2f8,(ulong)CONCAT44(rendered.m_height,rendered.m_width));
  }
  local_290._0_8_ = local_290 + 0x10;
  psVar1 = puVar11 + 2;
  if ((size_type *)*puVar11 == psVar1) {
    local_290._16_8_ = *psVar1;
    local_290._24_4_ = *(undefined4 *)(puVar11 + 3);
    local_290._28_4_ = *(undefined4 *)((long)puVar11 + 0x1c);
  }
  else {
    local_290._16_8_ = *psVar1;
    local_290._0_8_ = (size_type *)*puVar11;
  }
  local_290._8_8_ = puVar11[1];
  *puVar11 = psVar1;
  puVar11[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pixelFormat._0_8_ = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar3 = CONCAT44(uStack_30c,local_310) + pixelFormat._8_8_;
  uVar13 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_2b8) {
    uVar13 = local_2b8[0];
  }
  if (uVar13 < uVar3) {
    uVar13 = 0xf;
    if (local_318 != local_308) {
      uVar13 = local_308[0];
    }
    if (uVar13 < uVar3) goto LAB_00819fab;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,pixelFormat._0_8_);
  }
  else {
LAB_00819fab:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&pixelFormat,(ulong)local_318);
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar11 + 2);
  if ((pointer)*puVar11 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar11;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar11[1];
  *puVar11 = pfVar2;
  puVar11[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&section,(TestLog *)log,(string *)local_290,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_2b8) {
    operator_delete((void *)pixelFormat._0_8_,local_2b8[0] + 1);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(rendered.m_height,rendered.m_width),
                    rendered.m_pixels.m_cap + 1);
  }
  if ((int *)local_2f8.coordBits.m_data._0_8_ != piVar4) {
    operator_delete((void *)local_2f8.coordBits.m_data._0_8_,
                    CONCAT44(local_2f8.uvwBits.m_data[2],local_2f8.uvwBits.m_data[1]) + 1);
  }
  pFVar14 = (this->m_cases).
            super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_290,TEXTURETYPE_2D);
  width = util::TextureRenderer::getRenderWidth(this_00);
  height = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&rendered,width,height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pPVar6 = this->m_testParameters;
  util::createSampler((Sampler *)local_1f8,
                      (pPVar6->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapS,
                      (pPVar6->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapT,
                      (pPVar6->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (pPVar6->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  poVar5 = (ostringstream *)(local_1f8 + 8);
  local_22c = local_1f8._32_4_;
  local_23c = local_1f8._16_8_;
  local_290._68_8_ = local_1f8._0_8_;
  lStack_244 = local_1f8._8_8_;
  local_228._0_8_ = local_1f8._36_8_;
  local_228._8_8_ = local_1f8._44_8_;
  local_218 = local_1f8._52_8_;
  CStack_230 = (this->m_testParameters->super_TextureShadowCommonTestCaseParameters).compareOp;
  iStack_234 = local_1f8._24_4_;
  local_290._4_4_ = 3;
  local_210 = LODMODE_EXACT;
  local_290._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_290._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_290._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_290._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_290._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_290._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_290._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_290._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_290._32_4_ = pFVar14->ref;
  local_1f8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar5,"Compare reference value = ",0x1a);
  std::ostream::_M_insert<double>((double)(float)local_290._32_4_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_180);
  poVar5 = (ostringstream *)(local_1f8 + 8);
  local_1f8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Texture coordinates: ",0x15)
  ;
  tcu::operator<<((ostream *)poVar5,&pFVar14->minCoord);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," -> ",4);
  tcu::operator<<((ostream *)poVar5,&pFVar14->maxCoord);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_180);
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&pFVar14->minCoord,&pFVar14->maxCoord);
  util::TextureRenderer::renderQuad
            (this_00,&rendered,pFVar14->textureIndex,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(ReferenceParams *)local_290);
  ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  pixelFormat = getPixelFormat((TextureFormat)
                               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start);
  local_318 = (ulong *)0x1200000001;
  local_310 = 6;
  local_2f8.coordBits.m_data[0] = 0x14;
  local_2f8.coordBits.m_data[1] = 0x14;
  local_2f8.coordBits.m_data[2] = 0;
  local_2f8.uvwBits.m_data[0] = 7;
  local_2f8.uvwBits.m_data[1] = 7;
  local_2f8.uvwBits.m_data[2] = 0;
  local_2f8.pcfBits = 5;
  local_2f8.referenceBits = 0x10;
  local_2f8.resultBits = pixelFormat.redBits + -1;
  pTVar7 = ((this->super_TestInstance).m_context)->m_testCtx;
  local_320.order = RGBA;
  local_320.type = UNORM_INT8;
  data = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    data = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f8,&local_320,rendered.m_width,rendered.m_height,1,data);
  iVar9 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
  bVar8 = verifyTexCompareResult<tcu::Texture2D>
                    ((TestContext *)pTVar7->m_log,(ConstPixelBufferAccess *)local_1f8,
                     (Texture2D *)CONCAT44(extraout_var_00,iVar9),
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)local_290,&local_2f8,
                     (LodPrecision *)&local_318,&pixelFormat);
  if (bVar8) {
LAB_0081a4f2:
    iVar9 = this->m_caseNdx + 1;
    this->m_caseNdx = iVar9;
    iVar12 = (int)((ulong)((long)(this->m_cases).
                                 super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_cases).
                                super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance::FilterCase>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (SBORROW4(iVar9,iVar12 * -0x55555555) != iVar9 + iVar12 * 0x55555555 < 0) {
      tcu::TestStatus::incomplete();
      goto LAB_0081a64e;
    }
    local_1f8._0_8_ = (long)local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1f8._0_8_,
               local_1f8._8_8_ + local_1f8._0_8_);
  }
  else {
    local_1f8._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    poVar5 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Warning: Verification assuming high-quality PCF filtering failed."
               ,0x41);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_180);
    local_310 = 4;
    local_2f8.uvwBits.m_data[0] = 4;
    local_2f8.uvwBits.m_data[1] = 4;
    local_2f8.uvwBits.m_data[2] = 0;
    local_2f8.pcfBits = 0;
    pTVar7 = ((this->super_TestInstance).m_context)->m_testCtx;
    local_320.order = RGBA;
    local_320.type = UNORM_INT8;
    if (rendered.m_pixels.m_cap != 0) {
      rendered.m_pixels.m_cap = (size_t)rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1f8,&local_320,rendered.m_width,rendered.m_height,1,
               (void *)rendered.m_pixels.m_cap);
    iVar9 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
    bVar8 = verifyTexCompareResult<tcu::Texture2D>
                      ((TestContext *)pTVar7->m_log,(ConstPixelBufferAccess *)local_1f8,
                       (Texture2D *)CONCAT44(extraout_var_01,iVar9),
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_290,&local_2f8,
                       (LodPrecision *)&local_318,&pixelFormat);
    if (bVar8) goto LAB_0081a4f2;
    local_1f8._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    poVar5 = (ostringstream *)(local_1f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,
               "ERROR: Verification against low precision requirements failed, failing test case.",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_180);
    local_1f8._0_8_ = (long)local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Image verification failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1f8._0_8_,
               local_1f8._8_8_ + local_1f8._0_8_);
  }
  if (local_1f8._0_8_ != (long)local_1f8 + 0x10) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
LAB_0081a64e:
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&rendered);
  tcu::TestLog::endSection(section.m_log);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Texture2DShadowTestInstance::iterate (void)
{
	tcu::TestLog&					log				= m_context.getTestContext().getLog();
	const pipeline::TestTexture2D&	texture			= m_renderer.get2DTexture(m_cases[m_caseNdx].textureIndex);
	const tcu::TextureFormat		texFmt			= texture.getTextureFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section			(log, string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));

	const FilterCase&				curCase			= m_cases[m_caseNdx];
	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	vector<float>					texCoord;

	// Setup params for reference.
	sampleParams.sampler			= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.sampler.compare	= m_testParameters.compareOp;
	sampleParams.samplerType		= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.colorBias			= fmtInfo.lookupBias;
	sampleParams.colorScale			= fmtInfo.lookupScale;
	sampleParams.ref				= curCase.ref;

	log << TestLog::Message << "Compare reference value = " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	log << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	m_renderer.renderQuad(rendered, curCase.textureIndex, &texCoord[0], sampleParams);

	{
		const tcu::PixelFormat		pixelFormat			= getPixelFormat(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		tcu::LodPrecision			lodPrecision		(tcu::LodPrecision::RULE_VULKAN);
		tcu::TexComparePrecision	texComparePrecision;

		lodPrecision.derivateBits			= 18;
		lodPrecision.lodBits				= 6;
		texComparePrecision.coordBits		= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits			= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits			= 5;
		texComparePrecision.referenceBits	= 16;
		texComparePrecision.resultBits		= pixelFormat.redBits-1;

		const bool isHighQuality = verifyTexCompareResult(m_context.getTestContext(), rendered.getAccess(), texture.getTexture(),
														  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

			lodPrecision.lodBits			= 4;
			texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
			texComparePrecision.pcfBits		= 0;

			const bool isOk = verifyTexCompareResult(m_context.getTestContext(), rendered.getAccess(), texture.getTexture(),
													 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				return tcu::TestStatus::fail("Image verification failed");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}